

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O3

ON__UINT32 __thiscall ON_XMLVariant::DataCRC(ON_XMLVariant *this,ON__UINT32 crc)

{
  ON_XMLVariantPrivate *pOVar1;
  double dVar2;
  int iVar3;
  ON__UINT32 OVar4;
  anon_union_128_8_804602a9_for_ON_XMLVariantPrivate_3 *paVar5;
  int i;
  long lVar6;
  long lVar7;
  long lVar8;
  size_t count;
  ON__INT64 x [4];
  ON_Buffer local_98;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 uStack_20;
  
  iVar3 = (*this->_vptr_ON_XMLVariant[3])();
  switch(iVar3) {
  case 1:
    local_98.m_buffer_size =
         CONCAT71(local_98.m_buffer_size._1_7_,(this->_private->field_2)._bool_val);
    count = 1;
    break;
  case 2:
    local_98.m_buffer_size =
         CONCAT44(local_98.m_buffer_size._4_4_,(this->_private->field_2)._int_val);
    count = 4;
    break;
  case 3:
    dVar2 = ((double)(this->_private->field_2)._float_val + 1e-06) * 100000.0;
    goto LAB_006816b2;
  case 4:
    dVar2 = ((this->_private->field_2)._double_val + 1e-11) * 10000000000.0;
LAB_006816b2:
    local_98.m_buffer_size = (ON__UINT64)dVar2;
LAB_006816b7:
    count = 8;
    break;
  case 5:
    (*this->_vptr_ON_XMLVariant[0x2d])(&local_98,this);
    OVar4 = ON_wString::DataCRCLower((ON_wString *)&local_98,crc);
    ON_wString::~ON_wString((ON_wString *)&local_98);
    return OVar4;
  case 6:
    local_98.m_buffer_size =
         (ON__UINT64)(((this->_private->field_2)._double_val + 1e-11) * 10000000000.0);
    local_98.m_current_position =
         (ON__UINT64)(((this->_private->field_2).m_xform.m_xform[0][1] + 1e-11) * 10000000000.0);
    goto LAB_00681799;
  case 7:
    local_98.m_buffer_size = 0;
    local_98.m_current_position = 0;
    local_98.m_first_segment = (ON_BUFFER_SEGMENT *)0x0;
    pOVar1 = this->_private;
    lVar6 = 0;
    do {
      *(long *)(local_98.m_reserved + lVar6 * 8 + -0x34) =
           (long)((*(double *)((long)&pOVar1->field_2 + lVar6 * 8) + 1e-11) * 10000000000.0);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    count = 0x18;
    break;
  case 8:
  case 9:
    local_98.m_first_segment = (ON_BUFFER_SEGMENT *)0x0;
    local_98.m_last_segment = (ON_BUFFER_SEGMENT *)0x0;
    local_98.m_buffer_size = 0;
    local_98.m_current_position = 0;
    pOVar1 = this->_private;
    lVar6 = 0;
    do {
      *(long *)(local_98.m_reserved + lVar6 * 8 + -0x34) =
           (long)((*(double *)((long)&pOVar1->field_2 + lVar6 * 8) + 1e-11) * 10000000000.0);
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    count = 0x20;
    break;
  case 10:
    local_28 = 0;
    uStack_20 = 0;
    local_38 = 0;
    uStack_30 = 0;
    local_48 = 0;
    uStack_40 = 0;
    local_58 = 0;
    uStack_50 = 0;
    local_98.m_last_error = 0;
    local_98.m_reserved[0] = '\0';
    local_98.m_reserved[1] = '\0';
    local_98.m_reserved[2] = '\0';
    local_98.m_reserved[3] = '\0';
    local_98.m_reserved[4] = '\0';
    local_98.m_reserved[5] = '\0';
    local_98.m_reserved[6] = '\0';
    local_98.m_reserved[7] = '\0';
    local_98.m_reserved[8] = '\0';
    local_98.m_reserved[9] = '\0';
    local_98.m_reserved[10] = '\0';
    local_98.m_reserved[0xb] = '\0';
    local_98.m_current_segment = (ON_BUFFER_SEGMENT *)0x0;
    local_98.m_error_handler = (ON_Buffer_ErrorHandler)0x0;
    local_98.m_first_segment = (ON_BUFFER_SEGMENT *)0x0;
    local_98.m_last_segment = (ON_BUFFER_SEGMENT *)0x0;
    local_98.m_buffer_size = 0;
    local_98.m_current_position = 0;
    paVar5 = &this->_private->field_2;
    lVar6 = 0;
    lVar7 = 0;
    do {
      lVar7 = (long)(int)lVar7;
      lVar8 = 0;
      do {
        *(long *)(local_98.m_reserved + lVar7 * 8 + -0x34) =
             (long)((paVar5->_array_val[lVar8] + 1e-11) * 10000000000.0);
        lVar7 = lVar7 + 1;
        lVar8 = lVar8 + 4;
      } while (lVar8 != 0x10);
      lVar6 = lVar6 + 1;
      paVar5 = (anon_union_128_8_804602a9_for_ON_XMLVariantPrivate_3 *)((long)paVar5 + 8);
    } while (lVar6 != 4);
    count = 0x80;
    break;
  case 0xb:
    local_98.m_buffer_size = (ON__UINT64)(this->_private->field_2)._double_val;
    local_98.m_current_position = (ON__UINT64)(this->_private->field_2).m_xform.m_xform[0][1];
LAB_00681799:
    count = 0x10;
    break;
  case 0xc:
    local_98.m_buffer_size = (ON__UINT64)(this->_private->field_2)._double_val;
    goto LAB_006816b7;
  case 0xd:
    (*this->_vptr_ON_XMLVariant[0x2b])(&local_98,this);
    crc = ON_Buffer::CRC32(&local_98,crc);
    ON_Buffer::~ON_Buffer(&local_98);
  default:
    goto switchD_00681542_default;
  }
  crc = ON_CRC32(crc,count,&local_98);
switchD_00681542_default:
  return crc;
}

Assistant:

ON__UINT32 ON_XMLVariant::DataCRC(ON__UINT32 crc) const
{
  switch (Type())
  {
  default:
    return crc;

  case Types::Double:
    return CRCReal(crc, _private->_double_val);

  case Types::Float:
    return CRCReal(crc, _private->_float_val);

  case Types::Integer:
  {
    const auto x = _private->_int_val;
    return ON_CRC32(crc, sizeof(x), &x);
  }

  case Types::DoubleArray2:
  {
    ON__INT64 x[2] = { 0 };
    for (int i = 0; i < 2; i++) x[i] = Integerize(_private->_array_val[i]);
    return ON_CRC32(crc, sizeof(x), &x);
  }

  case Types::DoubleArray3:
  {
    ON__INT64 x[3] = { 0 };
    for (int i = 0; i < 3; i++) x[i] = Integerize(_private->_array_val[i]);
    return ON_CRC32(crc, sizeof(x), &x);
  }

  case Types::DoubleArray4:
  case Types::DoubleColor4:
  {
    ON__INT64 x[4] = { 0 };
    for (int i = 0; i < 4; i++) x[i] = Integerize(_private->_array_val[i]);
    return ON_CRC32(crc, sizeof(x), &x);
  }

  case Types::Matrix:
  {
    int index = 0;
    ON__INT64 x[16] = { 0 };
    for (int j = 0; j < 4; j++)
      for (int i = 0; i < 4; i++)
        x[index++] = Integerize(_private->m_xform.m_xform[i][j]);
    return ON_CRC32(crc, sizeof(x), &x);
  }

  case Types::Bool:
  {
    const auto x = _private->_bool_val;
    return ON_CRC32(crc, sizeof(x), &x);
  }

  case Types::Uuid:
  {
    const auto u = _private->_uuid_val;
    return ON_CRC32(crc, sizeof(u), &u);
  }

  case Types::Time:
  {
    const auto t = _private->_time_val;
    return ON_CRC32(crc, sizeof(t), &t);
  }

  case Types::Buffer:
  {
    return AsBuffer().CRC32(crc);
  }

  case Types::String:
    return AsString().DataCRCLower(crc);
  }
}